

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartInputFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::MultiPartInputFile::MultiPartInputFile
          (MultiPartInputFile *this,char *fileName,int numThreads,bool reconstructChunkOffsetTable)

{
  IStream *pIVar1;
  void *pvVar2;
  char *fileName_00;
  StdIFStream *in_RDI;
  stringstream _iex_replace_s;
  MultiPartInputFile *in_stack_000000e0;
  BaseExc *e;
  undefined1 in_stack_fffffffffffffe07;
  int in_stack_fffffffffffffe08;
  undefined1 in_stack_fffffffffffffe0f;
  Data *in_stack_fffffffffffffe10;
  
  GenericInputFile::GenericInputFile((GenericInputFile *)in_RDI);
  (in_RDI->super_IStream)._vptr_IStream = (_func_int **)&PTR__MultiPartInputFile_0374bc58;
  pIVar1 = &in_RDI->super_IStream;
  pvVar2 = operator_new(0xa8);
  Data::Data(in_stack_fffffffffffffe10,(bool)in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08,
             (bool)in_stack_fffffffffffffe07);
  *(void **)&pIVar1->_fileName = pvVar2;
  fileName_00 = (char *)operator_new(0x38);
  StdIFStream::StdIFStream(in_RDI,fileName_00);
  *(char **)(*(long *)&(in_RDI->super_IStream)._fileName + 0x28) = fileName_00;
  initialize(in_stack_000000e0);
  return;
}

Assistant:

MultiPartInputFile::MultiPartInputFile(const char fileName[],
                           int numThreads,
                           bool reconstructChunkOffsetTable):
    _data(new Data(true, numThreads, reconstructChunkOffsetTable))
{
    try
    {
        _data->is = new StdIFStream (fileName);
        initialize();
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
        delete _data;

        REPLACE_EXC (e, "Cannot read image file "
                     "\"" << fileName << "\". " << e.what());
        throw;
    }
    catch (...)
    {
        delete _data;
        throw;
    }
}